

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O3

char * __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  cmStateSnapshot *this_00;
  size_t __n;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  PointerType pBVar4;
  char *pcVar5;
  cmStateSnapshot *ci;
  pointer this_01;
  cmState *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  _Alloc_hider _Var8;
  cmStateSnapshot parent;
  cmStateSnapshot snp;
  cmStateSnapshot local_88;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_40;
  cmState *local_38;
  
  if (GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') {
    GetProperty();
  }
  GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length = 0;
  *GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p = '\0';
  iVar3 = std::__cxx11::string::compare((char *)prop);
  if (iVar3 == 0) {
    cmStateSnapshot::GetBuildsystemDirectoryParent(&local_88,&this->Snapshot_);
    bVar2 = cmStateSnapshot::IsValid(&local_88);
    if (bVar2) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&local_88);
      pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)local_70);
      return (pBVar4->Location)._M_dataplus._M_p;
    }
    return "";
  }
  __n = prop->_M_string_length;
  if ((__n == kBINARY_DIR_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,kBINARY_DIR_abi_cxx11_._M_dataplus._M_p,__n),
      iVar3 == 0)))) {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
LAB_001f7465:
    std::__cxx11::string::_M_assign
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
  }
  if ((__n == kSOURCE_DIR_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,kSOURCE_DIR_abi_cxx11_._M_dataplus._M_p,__n),
      iVar3 == 0)))) {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
    goto LAB_001f7465;
  }
  if ((__n == kSUBDIRECTORIES_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,kSUBDIRECTORIES_abi_cxx11_._M_dataplus._M_p,__n),
      iVar3 == 0)))) {
    local_88._0_16_ = ZEXT816(0);
    local_88.Position.Position = 0;
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88,
              ((long)(pBVar4->Children).
                     super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pBVar4->Children).
                     super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    this_01 = (pBVar4->Children).
              super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar1 = (pBVar4->Children).
             super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_01 != pcVar1) {
      do {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,this_01);
        pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           ((iterator *)local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88,&pBVar4->Location);
        this_01 = this_01 + 1;
      } while (this_01 != pcVar1);
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88,";");
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
               (string *)local_70);
    _Var8 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
    if ((cmState *)local_70._0_8_ == (cmState *)local_60) goto LAB_001f754e;
  }
  else {
    if ((__n == kBUILDSYSTEM_TARGETS_abi_cxx11_._M_string_length) &&
       ((__n == 0 ||
        (iVar3 = bcmp((prop->_M_dataplus)._M_p,kBUILDSYSTEM_TARGETS_abi_cxx11_._M_dataplus._M_p,__n)
        , iVar3 == 0)))) {
      pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         (&this->DirectoryState);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_70,&pBVar4->NormalTargetNames,";");
LAB_001f77cc:
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_70);
      if ((cmState *)local_70._0_8_ == (cmState *)local_60) {
        return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
      }
      operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    iVar3 = std::__cxx11::string::compare((char *)prop);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)prop);
      if (iVar3 == 0) {
        cmState::GetCacheEntryKeys_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88,(this->Snapshot_).State);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)local_70,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (string *)local_70);
        if ((cmState *)local_70._0_8_ != (cmState *)local_60) {
          operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
        return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
      }
      iVar3 = std::__cxx11::string::compare((char *)prop);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)prop);
        if (iVar3 == 0) {
          local_88._0_16_ = GetIncludeDirectoriesEntries_abi_cxx11_(this);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)prop);
          if (iVar3 == 0) {
            local_88._0_16_ = GetCompileOptionsEntries_abi_cxx11_(this);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)prop);
            if (iVar3 == 0) {
              local_88._0_16_ = GetCompileDefinitionsEntries_abi_cxx11_(this);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)prop);
              if (iVar3 == 0) {
                local_88._0_16_ = GetLinkOptionsEntries_abi_cxx11_(this);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)prop);
                if (iVar3 != 0) {
                  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                           operator->(&this->DirectoryState);
                  pcVar5 = cmPropertyMap::GetPropertyValue(&pBVar4->Properties,prop);
                  if (!chain || pcVar5 != (char *)0x0) {
                    return pcVar5;
                  }
                  cmStateSnapshot::GetBuildsystemDirectoryParent(&local_88,&this->Snapshot_);
                  bVar2 = cmStateSnapshot::IsValid(&local_88);
                  if (bVar2) {
                    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&local_88);
                    pcVar5 = GetProperty((cmStateDirectory *)local_70,prop,true);
                    return pcVar5;
                  }
                  pcVar5 = cmState::GetGlobalProperty((this->Snapshot_).State,prop);
                  return pcVar5;
                }
                local_88._0_16_ = GetLinkDirectoriesEntries_abi_cxx11_(this);
              }
            }
          }
        }
        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ((string *)local_70,
                   (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&local_88,";");
        goto LAB_001f77cc;
      }
      cmStateSnapshot::ClosureKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88,&this->Snapshot_);
      cmState::GetCacheEntryKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_60 + 0x18),(this->Snapshot_).State);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 local_88.Position.Tree,local_60._24_8_,pcStack_40);
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_88.State,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_88.Position.Tree);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_70,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88,";");
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_70);
      if ((cmState *)local_70._0_8_ != (cmState *)local_60) {
        operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
      }
      _Var8._M_p = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_60 + 0x18));
      goto LAB_001f754e;
    }
    local_88._0_16_ = ZEXT816(0);
    local_88.Position.Position = 0;
    local_38 = (cmState *)(this->Snapshot_).Position.Position;
    this_00 = (cmStateSnapshot *)(local_60 + 0x18);
    local_60._24_8_ = (this->Snapshot_).State;
    pcStack_40 = (this->Snapshot_).Position.Tree;
    while (bVar2 = cmStateSnapshot::IsValid(this_00), bVar2) {
      cmStateSnapshot::GetExecutionListFile_abi_cxx11_((string *)local_70,this_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 (string *)local_70);
      if ((cmState *)local_70._0_8_ != (cmState *)local_60) {
        operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
      }
      cmStateSnapshot::GetCallStackParent((cmStateSnapshot *)local_70,this_00);
      local_38 = (cmState *)local_60._0_8_;
      local_60._24_8_ = local_70._0_8_;
      pcStack_40 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_70._8_8_;
    }
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_88.Position.Tree + -0x20);
    pcVar6 = local_88.State;
    if (local_88.State < pbVar7 && local_88.State != (cmState *)local_88.Position.Tree) {
      do {
        std::__cxx11::string::swap((string *)pcVar6);
        pcVar6 = (cmState *)((long)pcVar6 + 0x20);
        pbVar7 = pbVar7 + -1;
      } while (pcVar6 < pbVar7);
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88,";");
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
               (string *)local_70);
    _Var8 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
    if ((cmState *)local_70._0_8_ == (cmState *)local_60) goto LAB_001f754e;
  }
  operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
  _Var8 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
LAB_001f754e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  return _Var8._M_p;
}

Assistant:

const char* cmStateDirectory::GetProperty(const std::string& prop,
                                          bool chain) const
{
  static std::string output;
  output.clear();
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return parent.GetDirectory().GetCurrentSource().c_str();
    }
    return "";
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return output.c_str();
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return output.c_str();
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    child_dirs.reserve(children.size());
    for (cmStateSnapshot const& ci : children) {
      child_dirs.push_back(ci.GetDirectory().GetCurrentSource());
    }
    output = cmJoin(child_dirs, ";");
    return output.c_str();
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmJoin(this->DirectoryState->NormalTargetNames, ";");
    return output.c_str();
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return output.c_str();
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return output.c_str();
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    std::vector<std::string> cacheKeys =
      this->Snapshot_.State->GetCacheEntryKeys();
    res.insert(res.end(), cacheKeys.begin(), cacheKeys.end());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return output.c_str();
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "LINK_OPTIONS") {
    output = cmJoin(this->GetLinkOptionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "LINK_DIRECTORIES") {
    output = cmJoin(this->GetLinkDirectoriesEntries(), ";");
    return output.c_str();
  }

  const char* retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}